

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  IntegerVersion IVar1;
  bool bVar2;
  TargetType TVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  string *psVar6;
  ulong uVar7;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  IntegerVersion *pIVar8;
  char *pcVar9;
  bool *in_R8;
  pair<std::_Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar11;
  byte local_466;
  byte local_465;
  byte local_464;
  bool local_463;
  byte local_462;
  byte local_461;
  byte local_460;
  byte local_45f;
  byte local_45e;
  bool local_45d;
  cmGeneratorTarget *local_328;
  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> local_320;
  allocator<char> local_311;
  string local_310 [8];
  string comp;
  undefined1 local_2e8 [8];
  string version;
  allocator<char> local_2a1;
  undefined1 local_2a0 [8];
  string msg;
  bool local_277;
  bool local_276;
  bool local_275;
  byte local_274;
  byte local_273;
  bool rccDisabled;
  bool uicDisabled;
  bool mocDisabled;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool rccAvailable;
  bool uicAvailable;
  bool mocAvailable;
  bool validQt;
  uint local_268;
  IntegerVersion local_260;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> qtVersion;
  string local_230 [8];
  string rccExec;
  string local_208;
  string local_1e8 [8];
  string uicExec;
  string local_1c0;
  string local_1a0 [8];
  string mocExec;
  bool rcc;
  bool uic;
  IntegerVersion IStack_178;
  bool moc;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [8];
  string targetName_1;
  string local_f8;
  _Base_ptr local_d8;
  undefined1 local_d0;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string targetName;
  string local_78;
  cmMakefile *local_48;
  cmMakefile *makefile;
  bool globalAutoRccTarget;
  cmLocalGenerator *pcStack_38;
  bool globalAutoGenTarget;
  cmLocalGenerator *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  std::
  vector<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ::vector(&this->Initializers_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoGenTargets_);
  std::
  map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->GlobalAutoRccTargets_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->ExecutableTestOutputs_);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (localGenerators);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                       (localGenerators);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&localGen);
    if (!bVar2) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    pcStack_38 = *ppcVar4;
    makefile._7_1_ = 0;
    makefile._6_1_ = 0;
    pcVar5 = cmLocalGenerator::GetMakefile(pcStack_38);
    local_48 = pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_GLOBAL_AUTOGEN_TARGET",
               (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_78);
    bVar2 = cmSystemTools::IsOn(psVar6);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
    pcVar5 = local_48;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",&local_c1);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_c0);
      std::__cxx11::string::string((string *)local_a0,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_a0,"autogen");
      }
      pVar10 = std::
               map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               ::emplace<cmLocalGenerator*&,std::__cxx11::string>
                         ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                           *)&this->GlobalAutoGenTargets_,&stack0xffffffffffffffc8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0);
      local_d8 = (_Base_ptr)pVar10.first._M_node;
      local_d0 = pVar10.second;
      makefile._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_a0);
    }
    pcVar5 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_GLOBAL_AUTORCC_TARGET",
               (allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_f8);
    bVar2 = cmSystemTools::IsOn(psVar6);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(targetName_1.field_2._M_local_buf + 0xf));
    pcVar5 = local_48;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",&local_141);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar5,&local_140);
      std::__cxx11::string::string((string *)local_120,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_120,"autorcc");
      }
      std::
      map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::emplace<cmLocalGenerator*&,std::__cxx11::string>
                ((map<cmLocalGenerator*,std::__cxx11::string,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)&this->GlobalAutoRccTargets_,&stack0xffffffffffffffc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      makefile._6_1_ = 1;
      std::__cxx11::string::~string((string *)local_120);
    }
    this_00 = cmLocalGenerator::GetGeneratorTargets(pcStack_38);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                  *)&target);
      if (!bVar2) break;
      pIVar8 = (IntegerVersion *)
               __gnu_cxx::
               __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
               ::operator*(&__end2);
      IStack_178 = *pIVar8;
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)IStack_178);
      if (TVar3 < UTILITY) {
        bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)IStack_178);
        if (!bVar2) {
          mocExec.field_2._M_local_buf[0xf] =
               cmGeneratorTarget::GetPropertyAsBool
                         ((cmGeneratorTarget *)IStack_178,&cmQtAutoGen::GenAUTOMOC_abi_cxx11_);
          mocExec.field_2._M_local_buf[0xe] =
               cmGeneratorTarget::GetPropertyAsBool
                         ((cmGeneratorTarget *)IStack_178,&cmQtAutoGen::GenAUTOUIC_abi_cxx11_);
          mocExec.field_2._M_local_buf[0xd] =
               cmGeneratorTarget::GetPropertyAsBool
                         ((cmGeneratorTarget *)IStack_178,&cmQtAutoGen::GenAUTORCC_abi_cxx11_);
          IVar1 = IStack_178;
          if ((((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) ||
              ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0)) ||
             ((bool)mocExec.field_2._M_local_buf[0xd])) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c0,"AUTOMOC_EXECUTABLE",
                       (allocator<char> *)(uicExec.field_2._M_local_buf + 0xf));
            pcVar9 = cmGeneratorTarget::GetSafeProperty((cmGeneratorTarget *)IVar1,&local_1c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1a0,pcVar9,(allocator<char> *)(uicExec.field_2._M_local_buf + 0xe));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(uicExec.field_2._M_local_buf + 0xe));
            std::__cxx11::string::~string((string *)&local_1c0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(uicExec.field_2._M_local_buf + 0xf));
            IVar1 = IStack_178;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"AUTOUIC_EXECUTABLE",
                       (allocator<char> *)(rccExec.field_2._M_local_buf + 0xf));
            pcVar9 = cmGeneratorTarget::GetSafeProperty((cmGeneratorTarget *)IVar1,&local_208);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1e8,pcVar9,(allocator<char> *)(rccExec.field_2._M_local_buf + 0xe));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(rccExec.field_2._M_local_buf + 0xe));
            std::__cxx11::string::~string((string *)&local_208);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(rccExec.field_2._M_local_buf + 0xf));
            IVar1 = IStack_178;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&qtVersion.second,"AUTORCC_EXECUTABLE",
                       (allocator<char> *)((long)&qtVersion.first.Minor + 3));
            pcVar9 = cmGeneratorTarget::GetSafeProperty
                               ((cmGeneratorTarget *)IVar1,(string *)&qtVersion.second);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_230,pcVar9,(allocator<char> *)((long)&qtVersion.first.Minor + 2));
            std::allocator<char>::~allocator((allocator<char> *)((long)&qtVersion.first.Minor + 2));
            std::__cxx11::string::~string((string *)&qtVersion.second);
            std::allocator<char>::~allocator((allocator<char> *)((long)&qtVersion.first.Minor + 3));
            pVar11 = cmQtAutoGenInitializer::GetQtVersion((cmGeneratorTarget *)IStack_178);
            qtVersion.first.Major = pVar11.second;
            local_260.Major = pVar11.first.Major;
            local_45d = true;
            if ((local_260.Major != 4) && (local_45d = true, local_260.Major != 5)) {
              local_45d = local_260.Major == 6;
            }
            uicDisabled = local_45d;
            local_45e = 1;
            _mocDisabled = pVar11;
            if (local_45d == false) {
              local_260 = pVar11.first;
              local_45e = std::__cxx11::string::empty();
              pVar11.second = qtVersion.first.Major;
              pVar11.first = local_260;
              local_45e = local_45e ^ 0xff;
            }
            qtVersion.first.Major = pVar11.second;
            local_260 = pVar11.first;
            rccDisabled = (bool)(local_45e & 1);
            local_45f = 1;
            if ((uicDisabled & 1U) == 0) {
              local_45f = std::__cxx11::string::empty();
              pVar11.second = qtVersion.first.Major;
              pVar11.first = local_260;
              local_45f = local_45f ^ 0xff;
            }
            qtVersion.first.Major = pVar11.second;
            local_260 = pVar11.first;
            local_273 = local_45f & 1;
            local_460 = 1;
            if ((uicDisabled & 1U) == 0) {
              local_460 = std::__cxx11::string::empty();
              pVar11.second = qtVersion.first.Major;
              pVar11.first = local_260;
              local_460 = local_460 ^ 0xff;
            }
            qtVersion.first.Major = pVar11.second;
            local_260 = pVar11.first;
            local_274 = local_460 & 1;
            local_461 = 0;
            if ((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) {
              local_461 = rccDisabled;
            }
            local_275 = (bool)(local_461 & 1);
            local_462 = 0;
            if ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0) {
              local_462 = local_273;
            }
            local_276 = (bool)(local_462 & 1);
            local_463 = false;
            if ((mocExec.field_2._M_local_buf[0xd] & 1U) != 0) {
              local_463 = (bool)local_274;
            }
            local_277 = local_463;
            local_464 = 0;
            if ((mocExec.field_2._M_local_buf[0xf] & 1U) != 0) {
              local_464 = rccDisabled ^ 0xff;
            }
            local_465 = 0;
            if ((mocExec.field_2._M_local_buf[0xe] & 1U) != 0) {
              local_465 = local_273 ^ 0xff;
            }
            msg.field_2._M_local_buf[0xf] = local_465 & 1;
            local_466 = 0;
            if ((mocExec.field_2._M_local_buf[0xd] & 1U) != 0) {
              local_466 = local_274 ^ 0xff;
            }
            msg.field_2._M_local_buf[0xe] = local_466 & 1;
            if ((((local_464 & 1) != 0) || (msg.field_2._M_local_buf[0xf] != 0)) ||
               (msg.field_2._M_local_buf[0xe] != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2a0,"AUTOGEN: No valid Qt version found for target ",
                         &local_2a1);
              std::allocator<char>::~allocator(&local_2a1);
              psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)IStack_178);
              std::__cxx11::string::operator+=((string *)local_2a0,(string *)psVar6);
              std::__cxx11::string::operator+=((string *)local_2a0,". ");
              cmQtAutoGen::Tools_abi_cxx11_
                        ((string *)((long)&version.field_2 + 8),
                         (cmQtAutoGen *)(ulong)(local_464 & 1),
                         (bool)(msg.field_2._M_local_buf[0xf] & 1),
                         (bool)(msg.field_2._M_local_buf[0xe] & 1),SUB81(in_R8,0));
              std::__cxx11::string::operator+=
                        ((string *)local_2a0,(string *)(version.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(version.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=((string *)local_2a0," disabled.  Consider adding:\n")
              ;
              comp.field_2._M_local_buf[0xe] = '\0';
              if (qtVersion.first.Major == 0) {
                std::allocator<char>::allocator();
                comp.field_2._M_local_buf[0xe] = '\x01';
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_2e8,"<QTVERSION>",
                           (allocator<char> *)(comp.field_2._M_local_buf + 0xf));
              }
              else {
                std::__cxx11::to_string((string *)local_2e8,qtVersion.first.Major);
              }
              if ((comp.field_2._M_local_buf[0xe] & 1U) != 0) {
                std::allocator<char>::~allocator
                          ((allocator<char> *)(comp.field_2._M_local_buf + 0xf));
              }
              pcVar9 = "Core";
              if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
                pcVar9 = "Widgets";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_310,pcVar9,&local_311);
              std::allocator<char>::~allocator(&local_311);
              std::__cxx11::string::operator+=((string *)local_2a0,"  find_package(Qt");
              std::__cxx11::string::operator+=((string *)local_2a0,(string *)local_2e8);
              std::__cxx11::string::operator+=((string *)local_2a0," COMPONENTS ");
              std::__cxx11::string::operator+=((string *)local_2a0,local_310);
              std::__cxx11::string::operator+=((string *)local_2a0,")\n");
              std::__cxx11::string::~string(local_310);
              std::__cxx11::string::~string((string *)local_2e8);
              std::__cxx11::string::operator+=((string *)local_2a0,"to your CMakeLists.txt file.");
              cmMakefile::IssueMessage
                        (*(cmMakefile **)((long)IStack_178 + 8),AUTHOR_WARNING,(string *)local_2a0);
              std::__cxx11::string::~string((string *)local_2a0);
              pVar11.second = qtVersion.first.Major;
              pVar11.first = local_260;
            }
            qtVersion.first.Major = pVar11.second;
            local_260 = pVar11.first;
            if ((((local_275 & 1U) != 0) || ((local_276 & 1U) != 0)) || ((local_277 & 1U) != 0)) {
              in_R8 = &local_275;
              local_328 = (cmGeneratorTarget *)this;
              std::
              make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*&,cmQtAutoGen::IntegerVersion&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                        ((cmQtAutoGenGlobalInitializer **)&local_320,&local_328,
                         &stack0xfffffffffffffe88,(bool *)&local_260,in_R8,&local_276,&local_277,
                         (bool *)((long)&makefile + 7));
              std::
              vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
              ::
              emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                        ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                          *)this,&local_320);
              std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::~unique_ptr(&local_320);
              pVar11.second = qtVersion.first.Major;
              pVar11.first = local_260;
            }
            qtVersion.first.Major = pVar11.second;
            local_260 = pVar11.first;
            std::__cxx11::string::~string(local_230);
            std::__cxx11::string::~string(local_1e8);
            std::__cxx11::string::~string(local_1a0);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<cmLocalGenerator*> const& localGenerators)
{
  for (cmLocalGenerator* localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        GlobalAutoGenTargets_.emplace(localGen, std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        GlobalAutoRccTargets_.emplace(localGen, std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (cmGeneratorTarget* target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(cmQtAutoGen::GenAUTOMOC);
      bool const uic = target->GetPropertyAsBool(cmQtAutoGen::GenAUTOUIC);
      bool const rcc = target->GetPropertyAsBool(cmQtAutoGen::GenAUTORCC);
      if (moc || uic || rcc) {
        std::string const mocExec =
          target->GetSafeProperty("AUTOMOC_EXECUTABLE");
        std::string const uicExec =
          target->GetSafeProperty("AUTOUIC_EXECUTABLE");
        std::string const rccExec =
          target->GetSafeProperty("AUTORCC_EXECUTABLE");

        // We support Qt4, Qt5 and Qt6
        auto qtVersion = cmQtAutoGenInitializer::GetQtVersion(target);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          std::string msg = "AUTOGEN: No valid Qt version found for target ";
          msg += target->GetName();
          msg += ". ";
          msg += cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled);
          msg += " disabled.  Consider adding:\n";
          {
            std::string version = (qtVersion.second == 0)
              ? std::string("<QTVERSION>")
              : std::to_string(qtVersion.second);
            std::string comp = uicDisabled ? "Widgets" : "Core";
            msg += "  find_package(Qt";
            msg += version;
            msg += " COMPONENTS ";
            msg += comp;
            msg += ")\n";
          }
          msg += "to your CMakeLists.txt file.";
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          Initializers_.emplace_back(cm::make_unique<cmQtAutoGenInitializer>(
            this, target, qtVersion.first, mocIsValid, uicIsValid, rccIsValid,
            globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}